

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O0

BasicBlock * __thiscall
spvtools::opt::Loop::FindLoopPreheader(Loop *this,DominatorAnalysis *dom_analysis)

{
  pointer this_00;
  bool bVar1;
  uint32_t blk_id;
  CFG *this_01;
  DominatorTree *this_02;
  DominatorTreeNode *a;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  reference puVar2;
  anon_class_16_2_90bd3850 local_c8;
  function<void_(unsigned_int)> local_b8;
  pointer local_98;
  BasicBlock *const_loop_pred;
  bool local_85;
  uint32_t loop_header_id;
  bool is_preheader;
  DominatorTreeNode *pDStack_80;
  DominatorTreeNode *node;
  iterator iStack_70;
  uint32_t p_id;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> header_pred;
  BasicBlock *loop_pred;
  DominatorTreeNode *header_node;
  DominatorTree *dom_tree;
  CFG *cfg;
  DominatorAnalysis *dom_analysis_local;
  Loop *this_local;
  
  this_01 = IRContext::cfg(this->context_);
  this_02 = DominatorAnalysisBase::GetDomTree(&dom_analysis->super_DominatorAnalysisBase);
  a = DominatorTree::GetTreeNode(this_02,this->loop_header_);
  header_pred.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  blk_id = BasicBlock::id(this->loop_header_);
  __x = CFG::preds(this_01,blk_id);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2,__x);
  __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2);
  iStack_70 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2);
  do {
    bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffff90);
    if (!bVar1) {
      if (header_pred.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
        __assert_fail("loop_pred && \"The header node is the entry block ?\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_descriptor.cpp"
                      ,0xf3,
                      "BasicBlock *spvtools::opt::Loop::FindLoopPreheader(DominatorAnalysis *)");
      }
      local_85 = true;
      local_c8.loop_header_id = BasicBlock::id(this->loop_header_);
      this_00 = header_pred.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
      local_98 = header_pred.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage;
      local_c8.is_preheader = &local_85;
      const_loop_pred._4_4_ = local_c8.loop_header_id;
      std::function<void(unsigned_int)>::
      function<spvtools::opt::Loop::FindLoopPreheader(spvtools::opt::DominatorAnalysis*)::__0,void>
                ((function<void(unsigned_int)> *)&local_b8,&local_c8);
      BasicBlock::ForEachSuccessorLabel((BasicBlock *)this_00,&local_b8);
      std::function<void_(unsigned_int)>::~function(&local_b8);
      if ((local_85 & 1U) == 0) {
        this_local = (Loop *)0x0;
      }
      else {
        this_local = (Loop *)header_pred.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage;
      }
LAB_00a2f86c:
      loop_header_id = 1;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2);
      return (BasicBlock *)this_local;
    }
    puVar2 = __gnu_cxx::
             __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end2);
    node._4_4_ = *puVar2;
    pDStack_80 = DominatorTree::GetTreeNode(this_02,node._4_4_);
    if ((pDStack_80 != (DominatorTreeNode *)0x0) &&
       (bVar1 = DominatorTree::Dominates(this_02,a,pDStack_80), !bVar1)) {
      if ((header_pred.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage != (pointer)0x0) &&
         (pDStack_80->bb_ !=
          (BasicBlock *)
          header_pred.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage)) {
        this_local = (Loop *)0x0;
        goto LAB_00a2f86c;
      }
      header_pred.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)pDStack_80->bb_;
    }
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++(&__end2);
  } while( true );
}

Assistant:

BasicBlock* Loop::FindLoopPreheader(DominatorAnalysis* dom_analysis) {
  CFG* cfg = context_->cfg();
  DominatorTree& dom_tree = dom_analysis->GetDomTree();
  DominatorTreeNode* header_node = dom_tree.GetTreeNode(loop_header_);

  // The loop predecessor.
  BasicBlock* loop_pred = nullptr;

  auto header_pred = cfg->preds(loop_header_->id());
  for (uint32_t p_id : header_pred) {
    DominatorTreeNode* node = dom_tree.GetTreeNode(p_id);
    if (node && !dom_tree.Dominates(header_node, node)) {
      // The predecessor is not part of the loop, so potential loop preheader.
      if (loop_pred && node->bb_ != loop_pred) {
        // If we saw 2 distinct predecessors that are outside the loop, we don't
        // have a loop preheader.
        return nullptr;
      }
      loop_pred = node->bb_;
    }
  }
  // Safe guard against invalid code, SPIR-V spec forbids loop with the entry
  // node as header.
  assert(loop_pred && "The header node is the entry block ?");

  // So we have a unique basic block that can enter this loop.
  // If this loop is the unique successor of this block, then it is a loop
  // preheader.
  bool is_preheader = true;
  uint32_t loop_header_id = loop_header_->id();
  const auto* const_loop_pred = loop_pred;
  const_loop_pred->ForEachSuccessorLabel(
      [&is_preheader, loop_header_id](const uint32_t id) {
        if (id != loop_header_id) is_preheader = false;
      });
  if (is_preheader) return loop_pred;
  return nullptr;
}